

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O0

char * VL53L1X::rangeStatusToString(RangeStatus status)

{
  char *pcStack_10;
  RangeStatus status_local;
  
  if (status == RangeValid) {
    pcStack_10 = "range valid";
  }
  else if (status == SigmaFail) {
    pcStack_10 = "sigma fail";
  }
  else if (status == SignalFail) {
    pcStack_10 = "signal fail";
  }
  else if (status == RangeValidMinRangeClipped) {
    pcStack_10 = "range valid, min range clipped";
  }
  else if (status == OutOfBoundsFail) {
    pcStack_10 = "out of bounds fail";
  }
  else if (status == HardwareFail) {
    pcStack_10 = "hardware fail";
  }
  else if (status == RangeValidNoWrapCheckFail) {
    pcStack_10 = "range valid, no wrap check fail";
  }
  else if (status == WrapTargetFail) {
    pcStack_10 = "wrap target fail";
  }
  else if (status == XtalkSignalFail) {
    pcStack_10 = "xtalk signal fail";
  }
  else if (status == SynchronizationInt) {
    pcStack_10 = "synchronization int";
  }
  else if (status == MinRangeFail) {
    pcStack_10 = "min range fail";
  }
  else if (status == RangeInvalid) {
    pcStack_10 = "no update";
  }
  else {
    pcStack_10 = "unknown status";
  }
  return pcStack_10;
}

Assistant:

const char * VL53L1X::rangeStatusToString(VL53L1X_DEFINITIONS::RangeStatus status)
{
  switch (status)
  {
    case VL53L1X_DEFINITIONS::RangeValid:
      return "range valid";

    case VL53L1X_DEFINITIONS::SigmaFail:
      return "sigma fail";

    case VL53L1X_DEFINITIONS::SignalFail:
      return "signal fail";

    case VL53L1X_DEFINITIONS::RangeValidMinRangeClipped:
      return "range valid, min range clipped";

    case VL53L1X_DEFINITIONS::OutOfBoundsFail:
      return "out of bounds fail";

    case VL53L1X_DEFINITIONS::HardwareFail:
      return "hardware fail";

    case VL53L1X_DEFINITIONS::RangeValidNoWrapCheckFail:
      return "range valid, no wrap check fail";

    case VL53L1X_DEFINITIONS::WrapTargetFail:
      return "wrap target fail";

    case VL53L1X_DEFINITIONS::XtalkSignalFail:
      return "xtalk signal fail";

    case VL53L1X_DEFINITIONS::SynchronizationInt:
      return "synchronization int";

    case VL53L1X_DEFINITIONS::MinRangeFail:
      return "min range fail";

    case VL53L1X_DEFINITIONS::RangeInvalid:
      return "no update";

    default:
      return "unknown status";
  }
}